

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler *
llama_sampler_init_dry
          (llama_vocab *vocab,int32_t context_size,float dry_multiplier,float dry_base,
          int32_t dry_allowed_length,int32_t dry_penalty_last_n,char **seq_breakers,
          size_t num_breakers)

{
  char *__s;
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  uint32_t uVar4;
  long lVar5;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> _Var6;
  int32_t *ctx;
  llama_sampler *plVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  size_type __n;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it;
  size_t sVar11;
  initializer_list<int> __l;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  pVar12;
  int local_148;
  allocator_type local_141;
  llama_vocab *local_140;
  int32_t local_138;
  int32_t local_134;
  int32_t local_130;
  int32_t local_12c;
  char **local_128;
  size_t local_120;
  string sequence_break;
  string local_f8;
  size_t local_d0;
  long local_c8;
  string word;
  vector<int,_std::allocator<int>_> tokenization;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  processed_breakers;
  
  local_12c = 0;
  if (0 < dry_penalty_last_n) {
    local_12c = dry_penalty_last_n;
  }
  if (dry_penalty_last_n == -1) {
    local_12c = context_size;
  }
  processed_breakers._M_h._M_buckets = &processed_breakers._M_h._M_single_bucket;
  processed_breakers._M_h._M_bucket_count = 1;
  processed_breakers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  processed_breakers._M_h._M_element_count = 0;
  processed_breakers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  processed_breakers._M_h._M_rehash_policy._M_next_resize = 0;
  processed_breakers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar8 = (dry_multiplier != 0.0 && 1.0 <= dry_base) && dry_penalty_last_n != 0;
  local_140 = vocab;
  local_138 = context_size;
  local_134 = dry_allowed_length;
  local_130 = dry_penalty_last_n;
  local_128 = seq_breakers;
  if (((bVar8) && (seq_breakers != (char **)0x0)) && (num_breakers != 0)) {
    local_d0 = num_breakers;
    for (sVar11 = 0; sVar11 != num_breakers; sVar11 = sVar11 + 1) {
      __s = local_128[sVar11];
      local_120 = sVar11;
      if ((__s == (char *)0x0) || (*__s == '\0')) {
        llama_log_internal(GGML_LOG_LEVEL_WARN,
                           "skipping null or empty DRY sequence breaker at index %zu\n",sVar11);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sequence_break,__s,(allocator<char> *)&word);
        if (sequence_break._M_string_length == 0) {
          llama_log_internal(GGML_LOG_LEVEL_WARN,"skipping empty DRY sequence breaker\n");
        }
        else {
          if (0x28 < sequence_break._M_string_length) {
            llama_log_internal(GGML_LOG_LEVEL_WARN,
                               "truncating DRY sequence breaker to %d characters\n",0x28);
            std::__cxx11::string::resize((ulong)&sequence_break);
          }
          iVar10 = 0;
          while( true ) {
            local_148 = iVar10;
            uVar4 = llama_vocab::n_tokens(local_140);
            num_breakers = local_d0;
            if ((int)uVar4 <= iVar10) break;
            tokenization.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = local_148;
            __l._M_len = 1;
            __l._M_array = (iterator)&tokenization.super__Vector_base<int,_std::allocator<int>_>;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_f8,__l,&local_141);
            llama_vocab::detokenize_abi_cxx11_
                      ((string *)&word,local_140,(vector<int,_std::allocator<int>_> *)&local_f8,true
                      );
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&local_f8);
            lVar5 = std::__cxx11::string::find((string *)&word,(ulong)&sequence_break);
            sVar2 = word._M_string_length;
            sVar1 = sequence_break._M_string_length;
            if (lVar5 == -1) {
              local_c8 = sequence_break._M_string_length + (sequence_break._M_string_length == 0);
LAB_002463ab:
              lVar5 = std::__cxx11::string::find
                                ((char)&word,(ulong)(uint)(int)*sequence_break._M_dataplus._M_p);
              if (lVar5 != -1) {
                for (uVar9 = 1; (uVar9 < sVar1 && (lVar5 + uVar9 < sVar2)); uVar9 = uVar9 + 1) {
                  if (*(char *)(CONCAT44(word._M_dataplus._M_p._4_4_,word._M_dataplus._M_p._0_4_) +
                                lVar5 + uVar9) != sequence_break._M_dataplus._M_p[uVar9])
                  goto LAB_002463ab;
                }
                std::__cxx11::string::substr((ulong)&local_f8,(ulong)&sequence_break);
                llama_vocab::tokenize
                          ((vector<int,_std::allocator<int>_> *)
                           &tokenization.super__Vector_base<int,_std::allocator<int>_>,local_140,
                           &local_f8,false,false);
                std::__cxx11::string::~string((string *)&local_f8);
                if (0x50 < (ulong)((long)tokenization.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  CONCAT44(tokenization.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start._4_4_,
                                           (int)tokenization.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start))) {
                  std::vector<int,_std::allocator<int>_>::resize
                            ((vector<int,_std::allocator<int>_> *)
                             &tokenization.super__Vector_base<int,_std::allocator<int>_>,0x14);
                }
                pVar12 = std::
                         _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                         ::equal_range(&processed_breakers._M_h,&local_148);
                for (_Var6._M_cur = (__node_type *)
                                    pVar12.first.
                                    super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                    ._M_cur;
                    (_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                     )_Var6._M_cur !=
                    pVar12.second.
                    super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                    ._M_cur.
                    super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                    ; _Var6._M_cur = (__node_type *)((_Var6._M_cur)->super__Hash_node_base)._M_nxt)
                {
                  bVar3 = std::operator==((vector<int,_std::allocator<int>_> *)
                                          &tokenization.
                                           super__Vector_base<int,_std::allocator<int>_>,
                                          (vector<int,_std::allocator<int>_> *)
                                          ((long)&((_Var6._M_cur)->
                                                  super__Hash_node_value<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_storage._M_storage + 8));
                  if (bVar3) goto LAB_002464a1;
                }
                std::
                _Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                ::_M_emplace<int&,std::vector<int,std::allocator<int>>&>
                          ((_Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                            *)&processed_breakers,&local_148,
                           &tokenization.super__Vector_base<int,_std::allocator<int>_>);
LAB_002464a1:
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          (&tokenization.super__Vector_base<int,_std::allocator<int>_>);
                goto LAB_002463ab;
              }
            }
            else {
              local_f8._M_dataplus._M_p = (pointer)0x0;
              local_f8._M_string_length = 0;
              local_f8.field_2._M_allocated_capacity = 0;
              std::
              _Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              ::_M_emplace<int&,std::vector<int,std::allocator<int>>>
                        ((_Hashtable<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                          *)&processed_breakers,&local_148,&local_f8);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&local_f8);
            }
            std::__cxx11::string::~string((string *)&word);
            iVar10 = local_148 + 1;
          }
        }
        std::__cxx11::string::~string((string *)&sequence_break);
        sVar11 = local_120;
      }
    }
  }
  ctx = (int32_t *)operator_new(0xd8);
  *ctx = local_138;
  ctx[1] = (int32_t)dry_multiplier;
  ctx[2] = (int32_t)dry_base;
  ctx[3] = local_134;
  ctx[4] = local_130;
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::_Hashtable((_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                *)(ctx + 6),&processed_breakers._M_h);
  __n = (size_type)local_12c;
  if ((dry_multiplier != 0.0 && 1.0 <= dry_base) && dry_penalty_last_n != 0) {
    word._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(ctx + 0x14),__n,(value_type_conflict3 *)&word,
               (allocator_type *)&local_f8);
  }
  else {
    (((vector<int,_std::allocator<int>_> *)(ctx + 0x14))->
    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ctx[0x16] = 0;
    ctx[0x17] = 0;
    ctx[0x18] = 0;
    ctx[0x19] = 0;
  }
  ctx[0x22] = 0;
  ctx[0x23] = 0;
  *(int32_t **)(ctx + 0x1a) = ctx + 0x26;
  ctx[0x1c] = 1;
  ctx[0x1d] = 0;
  ctx[0x1e] = 0;
  ctx[0x1f] = 0;
  ctx[0x20] = 0;
  ctx[0x21] = 0;
  ctx[0x22] = 0x3f800000;
  ctx[0x24] = 0;
  ctx[0x25] = 0;
  ctx[0x26] = 0;
  ctx[0x27] = 0;
  sVar11 = 0;
  if (bVar8) {
    sVar11 = __n;
  }
  ring_buffer<int>::ring_buffer((ring_buffer<int> *)(ctx + 0x28),sVar11);
  plVar7 = llama_sampler_init(&llama_sampler_dry_i,ctx);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&processed_breakers._M_h);
  return plVar7;
}

Assistant:

struct llama_sampler * llama_sampler_init_dry(const struct llama_vocab * vocab, int32_t context_size, float dry_multiplier, float dry_base, int32_t dry_allowed_length, int32_t dry_penalty_last_n, const char** seq_breakers, size_t num_breakers) {
    int32_t effective_dry_penalty_last_n = (dry_penalty_last_n == -1) ? context_size : std::max(dry_penalty_last_n, 0);
    std::unordered_multimap<llama_token, std::vector<llama_token>> processed_breakers;
    const int MAX_CHAR_LEN = 40;
    const int MAX_SEQ_LEN = 20;

    const bool dry_enabled = (dry_multiplier != 0.0f && dry_base >= 1.0f && dry_penalty_last_n != 0);

    if (dry_enabled && seq_breakers != nullptr && num_breakers > 0) {
        // Process sequence breakers
        for (size_t i = 0; i < num_breakers; ++i) {
            if (seq_breakers[i] == nullptr || std::strlen(seq_breakers[i]) == 0) {
                LLAMA_LOG_WARN("skipping null or empty DRY sequence breaker at index %zu\n", i);
                continue;
            }

            std::string sequence_break(seq_breakers[i]);
            if (sequence_break.empty()) {
                LLAMA_LOG_WARN("skipping empty DRY sequence breaker\n");
                continue;
            }

            if (sequence_break.size() > MAX_CHAR_LEN) {
                LLAMA_LOG_WARN("truncating DRY sequence breaker to %d characters\n", MAX_CHAR_LEN);
                sequence_break.resize(MAX_CHAR_LEN);
            }

            get_overlapping_token_sequences(*vocab, sequence_break, processed_breakers, MAX_SEQ_LEN);
        }
    }

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_dry_i,
        /* .ctx   = */ new llama_sampler_dry {
            /* .total_context_size     = */ context_size,
            /* .dry_multiplier         = */ dry_multiplier,
            /* .dry_base               = */ dry_base,
            /* .dry_allowed_length     = */ dry_allowed_length,
            /* .dry_penalty_last_n     = */ dry_penalty_last_n,
            /* .dry_processed_breakers = */ std::move(processed_breakers),
            /* .dry_repeat_count       = */ dry_enabled ? std::vector<int>(effective_dry_penalty_last_n, 0) : std::vector<int>{},
            /* .dry_max_token_repeat   = */ {},
            /* .last_tokens            = */ dry_enabled ? ring_buffer<llama_token>(effective_dry_penalty_last_n) : ring_buffer<llama_token>(0),
        }
    );
}